

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O3

bool __thiscall Filesystem::add_fcb(Filesystem *this,int firstId,Fcb fcb)

{
  Fat *pFVar1;
  bool bVar2;
  Document *this_00;
  int i;
  long lVar3;
  uint uVar4;
  iterator __position;
  
  pFVar1 = this->pfat1;
  if (pFVar1->filelist[firstId] == 0) {
    pFVar1->filelist[firstId] = 0xffff;
  }
  do {
    uVar4 = firstId;
    firstId = (uint)pFVar1->filelist[(int)uVar4];
  } while (pFVar1->filelist[(int)uVar4] != 0xffff);
  this_00 = (Document *)operator_new(0x20);
  Document::Document(this_00,this->blocks[(int)uVar4]);
  __position._M_current =
       (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((ulong)((long)__position._M_current +
             (-0x3d8 - (long)(this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>.
                             _M_impl.super__Vector_impl_data._M_start)) < 0xfffffffffffffc00) {
    pFVar1 = this->pfat1;
    lVar3 = 6;
    do {
      if (pFVar1->filelist[lVar3] == 0) {
        pFVar1->filelist[(int)uVar4] = (Filelist)lVar3;
        pFVar1->filelist[lVar3] = 0xffff;
        Document::~Document(this_00);
        operator_delete(this_00,0x20);
        this_00 = (Document *)operator_new(0x20);
        Document::Document(this_00,this->blocks[(int)uVar4]);
        __position._M_current =
             (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
             super__Vector_impl_data._M_finish;
        goto LAB_001074fa;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 1000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Err]Current content is full!",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    bVar2 = false;
  }
  else {
LAB_001074fa:
    if (__position._M_current ==
        (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Fcb,std::allocator<Fcb>>::_M_realloc_insert<Fcb_const&>
                ((vector<Fcb,std::allocator<Fcb>> *)this_00,__position,&fcb);
    }
    else {
      (__position._M_current)->free = fcb.free;
      *(undefined7 *)&(__position._M_current)->field_0x21 = fcb._33_7_;
      (__position._M_current)->first = fcb.first;
      *(undefined4 *)&(__position._M_current)->field_0x14 = fcb._20_4_;
      (__position._M_current)->length = fcb.length;
      *&(__position._M_current)->filename = fcb.filename;
      (__position._M_current)->exname[0] = fcb.exname[0];
      (__position._M_current)->exname[1] = fcb.exname[1];
      (__position._M_current)->exname[2] = fcb.exname[2];
      (__position._M_current)->attribute = fcb.attribute;
      (__position._M_current)->time = fcb.time;
      (__position._M_current)->date = fcb.date;
      (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    Document::~Document(this_00);
    operator_delete(this_00,0x20);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Filesystem::add_fcb(int firstId,Fcb fcb)
{
    ///Step1
    int lastId = firstId;
    if ((*pfat1)[lastId]== FREE)
    {
        (*pfat1)[lastId]= END;
    }
    while ((*pfat1)[lastId] != END) {
        lastId = (*pfat1)[lastId];
    }
    Document* plastDoc = new Document(blocks[lastId]);

    if((plastDoc->fcbList.size()+1)*sizeof(Fcb)>= BLOCKSIZE)
    {
        int freeBlock = pfat1->get_FreeBlock();
        if (freeBlock==FULL)
        {
            cout << "[Err]Current content is full!"<<endl;
            return false;
        }
        (*pfat1)[lastId] = freeBlock;
        (*pfat1)[freeBlock] = END;
        delete plastDoc;
        plastDoc = new Document(blocks[lastId]);
    ///Step2
        plastDoc->fcbList.push_back(fcb);
    }
    else
    {
        plastDoc->fcbList.push_back(fcb);
    }
#ifdef DEBUG
    //cout << "size:" << plastDoc->fcbList.size()<<endl;
    //cout << plastDoc->fcbList[0].filename<<endl;
#endif

    delete plastDoc;
    return true;

}